

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

bool __thiscall
ON_MeshSeparateNgonInfo::TestNgonVertex(ON_MeshSeparateNgonInfo *this,uint *vertex_index_ptr)

{
  uint uVar1;
  uint new_vertex_index;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (vertex_index_ptr == (uint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar1 = *vertex_index_ptr;
    this->m_vi = uVar1;
    uVar5 = 1;
    if (uVar1 < this->m_vertex_count0) {
      new_vertex_index = this->m_ngon_vmap[uVar1];
      if (this->m_ngon_vmark != new_vertex_index) {
        if (new_vertex_index < this->m_vertex_count2 && this->m_vertex_count1 <= new_vertex_index) {
          bVar4 = AddVertexIndexRef(this,vertex_index_ptr,new_vertex_index);
          return bVar4;
        }
        puVar2 = this->m_vertex_face_map[uVar1];
        if ((puVar2 != (uint *)0x0) && (uVar7 = (ulong)*puVar2, uVar7 != 0)) {
          uVar6 = 0;
LAB_00529983:
          uVar5 = puVar2[uVar6 + 1];
          if (((this->m_fi == uVar5) || (this->m_face_count <= uVar5)) ||
             (this->m_ni == this->m_ngondex_from_facedex_map[uVar5])) goto LAB_00529998;
          bVar4 = AddVertexIndexRef(this,vertex_index_ptr,this->m_vertex_count2);
          uVar5 = 0;
          if (bVar4) {
            uVar1 = this->m_vertex_count2;
            this->m_ngon_vmap[this->m_vi] = uVar1;
            this->m_vertex_count2 = uVar1 + 1;
            puVar3 = this->m_ngondex_from_facedex_map;
            uVar6 = 0;
            do {
              uVar1 = puVar2[uVar6 + 1];
              if ((this->m_fi != uVar1) &&
                 ((this->m_face_count <= uVar1 || (this->m_ni != puVar3[uVar1])))) {
                if (uVar5 < uVar6) {
                  puVar2[(ulong)uVar5 + 1] = uVar1;
                }
                uVar5 = uVar5 + 1;
              }
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
            *puVar2 = uVar5;
            goto LAB_005299a4;
          }
          goto LAB_00529953;
        }
LAB_005299a0:
        this->m_ngon_vmap[uVar1] = this->m_ngon_vmark;
LAB_005299a4:
        uVar5 = 1;
      }
    }
  }
LAB_00529953:
  return SUB41(uVar5,0);
LAB_00529998:
  uVar6 = uVar6 + 1;
  if (uVar7 == uVar6) goto LAB_005299a0;
  goto LAB_00529983;
}

Assistant:

bool ON_MeshSeparateNgonInfo::TestNgonVertex(
  const unsigned int* vertex_index_ptr
  )
{
  if ( 0 == vertex_index_ptr )
    return false;
  m_vi = *vertex_index_ptr;
  if ( m_vi >= m_vertex_count0 )
  {
    // The source of this vertex index contained a bogus value.
    return true;
  }

  const unsigned int n = m_ngon_vmap[m_vi];
  
  if ( m_ngon_vmark == n )
  {
    // This vertex is known to be referenced only
    // by this ngon and does not need to be tested
    // or duplicated.
    return true;
  }

  if ( m_vertex_count1 <= n && n < m_vertex_count2 )
  {
    // this vertex is flagged for duplication in this ngon.
    return AddVertexIndexRef(vertex_index_ptr,n);
  }

  unsigned int* vfm = m_vertex_face_map[m_vi];
  const unsigned int vfm_count0 = (0 != vfm) ? *vfm++ : 0;
  if ( vfm_count0 > 0 )
  {
    for ( unsigned int vfmi = 0; vfmi < vfm_count0; vfmi++ )
    {
      unsigned int vfi = vfm[vfmi];
      if( m_fi == vfi )
        continue;
      if ( vfi >= m_face_count )
        continue;
      if ( m_ni == m_ngondex_from_facedex_map[vfi] )
        continue; // face[vfi] is in this ngon

      // this vertex is shared by a face not belonging to this ngon.
      if ( false == AddVertexIndexRef(vertex_index_ptr,m_vertex_count2) )
        return false;
      m_ngon_vmap[m_vi] = m_vertex_count2;
      m_vertex_count2++;

      // Any faces in this ngon that reference vertex m_vi
      // will be modified to reference vertex m_vertex_count2.
      // These faces need to be removed from vfm[], so
      // future searches for faces that share vertex m_vi
      // will be correct.
      unsigned int vfm_count1 = 0;
      for ( vfmi = 0; vfmi < vfm_count0; vfmi++ )
      {
        unsigned int vfi_local = vfm[vfmi];
        if( m_fi == vfi_local )
          continue;
        if ( vfi_local < m_face_count && m_ni == m_ngondex_from_facedex_map[vfi_local] )
          continue; // face[vfi_local] is in this ngon
        if ( vfmi > vfm_count1 )
          vfm[vfm_count1] = vfi_local;
        vfm_count1++;
      }
      vfm[-1] = vfm_count1;
      return true;
    }
  }

  // vertex is not shared
  m_ngon_vmap[m_vi] = m_ngon_vmark;
  return true;
}